

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O2

TiXmlString operator+(TiXmlString *a,TiXmlString *b)

{
  TiXmlString *in_RDX;
  
  a->rep_ = &TiXmlString::nullrep_;
  TiXmlString::reserve(a,in_RDX->rep_->size + b->rep_->size);
  TiXmlString::operator+=(a,b);
  TiXmlString::operator+=(a,in_RDX);
  return (TiXmlString)(Rep *)a;
}

Assistant:

TiXmlString operator + (const TiXmlString & a, const TiXmlString & b)
{
	TiXmlString tmp;
	tmp.reserve(a.length() + b.length());
	tmp += a;
	tmp += b;
	return tmp;
}